

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::computeFrhsXtra(SPxSolverBase<double> *this)

{
  double dVar1;
  Status SVar2;
  VectorBase<double> *pVVar3;
  ostream *poVar4;
  SPxInternalCodeException *this_00;
  long lVar5;
  allocator local_51;
  string local_50;
  
  lVar5 = 0;
  do {
    if ((this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
        thenum <= lVar5) {
      return;
    }
    SVar2 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar5];
    if (this->theRep * SVar2 < 1) {
      pVVar3 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.up;
      switch(SVar2) {
      default:
        poVar4 = std::operator<<((ostream *)&std::cerr,"ESVECS02 ERROR: ");
        poVar4 = std::operator<<(poVar4,"inconsistent basis must not happen!");
        std::endl<char,std::char_traits<char>>(poVar4);
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_50,"XSVECS02 This should never happen.",&local_51);
        SPxInternalCodeException::SPxInternalCodeException(this_00,&local_50);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      case P_ON_LOWER:
        pVVar3 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.low;
      case P_FIXED:
      case P_ON_UPPER:
        dVar1 = (pVVar3->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          local_50._M_dataplus._M_p = (pointer)((ulong)dVar1 ^ 0x8000000000000000);
          VectorBase<double>::multAdd<double,double>
                    (this->theFrhs,(double *)&local_50,
                     (SVectorBase<double> *)
                     ((this->thevectors->set).theitem + (this->thevectors->set).thekey[lVar5].idx));
        }
        break;
      case P_FREE:
        break;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::computeFrhsXtra()
{

   assert(rep()  == COLUMN);
   assert(type() == LEAVE);

   for(int i = 0; i < this->nCols(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = this->desc().colStatus(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         // columnwise cases:
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));

         //lint -fallthrough
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            x = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            x = SPxLPBase<R>::lower(i);
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS02 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS02 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}